

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlScanIDAttributeDecl(xmlValidCtxtPtr ctxt,xmlElementPtr elem,int err)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlValidState *pxVar4;
  
  pxVar4 = (xmlValidState *)&ctxt->vstateTab;
  iVar3 = 0;
  while( true ) {
    pxVar4 = (xmlValidState *)pxVar4->elemDecl;
    if (pxVar4 == (xmlValidState *)0x0) break;
    if ((*(int *)&pxVar4[3].node == 2) &&
       (iVar2 = iVar3 + 1, bVar1 = 0 < iVar3, iVar3 = iVar2, bVar1 && (int)elem != 0)) {
      xmlErrValidNode((xmlValidCtxtPtr)0x0,(xmlNodePtr)ctxt,XML_DTD_MULTIPLE_ID,
                      "Element %s has too many ID attributes defined : %s\n",
                      (xmlChar *)ctxt->warning,(xmlChar *)pxVar4->exec,(xmlChar *)0x0);
    }
    pxVar4 = pxVar4 + 3;
  }
  return iVar3;
}

Assistant:

static int
xmlScanIDAttributeDecl(xmlValidCtxtPtr ctxt, xmlElementPtr elem, int err) {
    xmlAttributePtr cur;
    int ret = 0;

    if (elem == NULL) return(0);
    cur = elem->attributes;
    while (cur != NULL) {
        if (cur->atype == XML_ATTRIBUTE_ID) {
	    ret ++;
	    if ((ret > 1) && (err))
		xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_MULTIPLE_ID,
	       "Element %s has too many ID attributes defined : %s\n",
		       elem->name, cur->name, NULL);
	}
	cur = cur->nexth;
    }
    return(ret);
}